

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O2

uint8_t read_cfl_alphas(FRAME_CONTEXT *ec_ctx,aom_reader *r,int8_t *signs_out)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char cVar4;
  uint8_t uVar5;
  int iVar6;
  
  iVar1 = aom_read_symbol_(r,ec_ctx->cfl_sign_cdf,8);
  cVar4 = (char)iVar1;
  iVar1 = cVar4 + 1;
  uVar3 = iVar1 * 0xb;
  iVar6 = (int)uVar3 >> 5;
  if (uVar3 < 0x20) {
    uVar5 = '\0';
  }
  else {
    iVar2 = aom_read_symbol_(r,ec_ctx->cfl_alpha_cdf[cVar4 + -2],0x10);
    uVar5 = (char)iVar2 << 4;
  }
  iVar1 = iVar6 * -3 + iVar1;
  if (iVar1 != 0) {
    iVar1 = aom_read_symbol_(r,ec_ctx->cfl_alpha_cdf[iVar1 * 3 + iVar6 + -3],0x10);
    uVar5 = uVar5 + (char)iVar1;
  }
  *signs_out = cVar4;
  return uVar5;
}

Assistant:

static uint8_t read_cfl_alphas(FRAME_CONTEXT *const ec_ctx, aom_reader *r,
                               int8_t *signs_out) {
  const int8_t joint_sign =
      aom_read_symbol(r, ec_ctx->cfl_sign_cdf, CFL_JOINT_SIGNS, "cfl:signs");
  uint8_t idx = 0;
  // Magnitudes are only coded for nonzero values
  if (CFL_SIGN_U(joint_sign) != CFL_SIGN_ZERO) {
    aom_cdf_prob *cdf_u = ec_ctx->cfl_alpha_cdf[CFL_CONTEXT_U(joint_sign)];
    idx = (uint8_t)aom_read_symbol(r, cdf_u, CFL_ALPHABET_SIZE, "cfl:alpha_u")
          << CFL_ALPHABET_SIZE_LOG2;
  }
  if (CFL_SIGN_V(joint_sign) != CFL_SIGN_ZERO) {
    aom_cdf_prob *cdf_v = ec_ctx->cfl_alpha_cdf[CFL_CONTEXT_V(joint_sign)];
    idx += (uint8_t)aom_read_symbol(r, cdf_v, CFL_ALPHABET_SIZE, "cfl:alpha_v");
  }
  *signs_out = joint_sign;
  return idx;
}